

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::priceByRowWithSwitch
          (HighsSparseMatrix *this,bool quad_precision,HVector *result,HVector *column,
          double expected_density,HighsInt from_index,double switch_density,HighsInt debug_report)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  pointer piVar10;
  undefined7 in_register_00000031;
  ulong uVar11;
  double *pdVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  pointer piVar17;
  double dVar18;
  double dVar19;
  HighsSparseVectorSum sum;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> result_array;
  HighsSparseVectorSum local_98;
  vector<double,_std::allocator<double>_> *local_60;
  double local_58;
  double local_50;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_48;
  
  uVar9 = (ulong)(uint)from_index;
  local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = switch_density;
  if ((int)CONCAT71(in_register_00000031,quad_precision) != 0) {
    iVar13 = this->num_col_;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_98.values,(long)iVar13);
    std::vector<int,_std::allocator<int>_>::reserve(&local_98.nonzeroinds,(long)iVar13);
  }
  if (-2 < debug_report) {
    puts("\nHighsSparseMatrix::priceByRowWithSwitch");
  }
  iVar13 = (int)uVar9;
  if ((expected_density <= 0.1) && (from_index < column->count)) {
    local_58 = 1.0 / (double)this->num_col_;
    local_60 = &result->array;
    lVar14 = (long)from_index;
    do {
      iVar13 = (int)uVar9;
      iVar3 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14];
      piVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + (long)iVar3 + 1;
      piVar8 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar3;
      if (this->format_ != kRowwisePartitioned) {
        piVar8 = piVar1;
      }
      iVar16 = *piVar8;
      if ((this->num_col_ <= (iVar16 - piVar1[-1]) + result->count) ||
         (local_50 < (double)result->count * local_58)) break;
      dVar19 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
      if ((debug_report == -1) || (iVar3 == debug_report)) {
        debugReportRowPrice(this,iVar3,dVar19,iVar16,local_60);
      }
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        iVar13 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        lVar15 = (long)iVar13;
        if (quad_precision) {
          if (iVar13 < iVar16) {
            iVar16 = iVar16 - iVar13;
            do {
              HighsSparseVectorSum::add
                        (&local_98,
                         (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar15],
                         (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar15] * dVar19);
              lVar15 = lVar15 + 1;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
        }
        else if (iVar13 < iVar16) {
          piVar10 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar17 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar4 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            uVar7 = piVar10[lVar15];
            uVar9 = (ulong)uVar7;
            dVar18 = pdVar4[(int)uVar7];
            dVar2 = pdVar5[lVar15];
            if ((dVar18 == 0.0) && (!NAN(dVar18))) {
              iVar13 = result->count;
              result->count = iVar13 + 1;
              piVar17[iVar13] = uVar7;
            }
            dVar18 = dVar2 * dVar19 + dVar18;
            uVar11 = -(ulong)(ABS(dVar18) < 1e-14);
            pdVar4[(int)uVar7] = (double)(~uVar11 & (ulong)dVar18 | uVar11 & 0x358dee7a4ad4b81f);
            lVar15 = lVar15 + 1;
          } while (iVar16 != lVar15);
        }
      }
      iVar13 = (int)uVar9;
      from_index = (int)lVar14 + 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 < column->count);
  }
  if (quad_precision) {
    uVar9 = (ulong)((long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    uVar7 = (uint)uVar9;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)(uVar7 & 0x7fffffff) + 1;
      do {
        iVar3 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11 - 2];
        iVar13 = iVar3 * 0x10;
        if (ABS(local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar3].hi +
                local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar3].lo) <= 1e-14) {
          iVar16 = (int)uVar9;
          uVar9 = (ulong)(iVar16 - 1);
          local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3].hi = 0.0;
          local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3].lo = 0.0;
          iVar13 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)iVar16 + -1];
          local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)iVar16 + -1] = iVar3;
          local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11 - 2] = iVar13;
        }
        uVar7 = (uint)uVar9;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_98.nonzeroinds,(long)(int)uVar7);
    piVar17 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar10 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (from_index < column->count) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector(&local_48,&local_98.values);
      priceByRowDenseResult(this,&local_48,column,from_index,iVar13);
      result->count = 0;
      iVar13 = this->num_col_;
      if (iVar13 < 1) {
        if (local_48.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0037dcbf;
      }
      else {
        piVar10 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar5 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar12 = &(local_48.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                    .super__Vector_impl_data._M_start)->lo;
        lVar14 = 0;
        do {
          dVar18 = ((HighsCDouble *)(pdVar12 + -1))->hi + *pdVar12;
          dVar19 = 0.0;
          if (1e-14 <= ABS(dVar18)) {
            iVar13 = result->count;
            result->count = iVar13 + 1;
            piVar10[iVar13] = (int)lVar14;
            iVar13 = this->num_col_;
            dVar19 = dVar18;
          }
          pdVar5[lVar14] = dVar19;
          lVar14 = lVar14 + 1;
          pdVar12 = pdVar12 + 2;
        } while (lVar14 < iVar13);
      }
      operator_delete(local_48.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    else {
      piVar6 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (piVar6 != (pointer)0x0) {
        operator_delete(piVar6);
        piVar10 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar17 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      std::vector<int,_std::allocator<int>_>::resize(&result->index,(long)this->num_col_);
      uVar7 = (uint)((ulong)((long)piVar17 - (long)piVar10) >> 2);
      result->count = uVar7;
      if (0 < (int)uVar7) {
        piVar10 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar5 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          iVar13 = piVar10[uVar9];
          pdVar5[iVar13] =
               local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar13].hi +
               local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar13].lo;
          uVar9 = uVar9 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar9);
      }
    }
  }
  else if (from_index < column->count) {
    priceByRowDenseResult(this,&result->array,column,from_index,-2);
    result->count = 0;
    iVar13 = this->num_col_;
    if (0 < iVar13) {
      piVar10 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = 0;
      do {
        if (1e-14 <= ABS(pdVar5[lVar14])) {
          iVar13 = result->count;
          result->count = iVar13 + 1;
          piVar10[iVar13] = (int)lVar14;
          iVar13 = this->num_col_;
        }
        else {
          pdVar5[lVar14] = 0.0;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar13);
    }
  }
  else {
    HVectorBase<double>::tight(result);
  }
LAB_0037dcbf:
  if (local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsSparseMatrix::priceByRowWithSwitch(
    const bool quad_precision, HVector& result, const HVector& column,
    const double expected_density, const HighsInt from_index,
    const double switch_density, const HighsInt debug_report) const {
  assert(this->isRowwise());
  HighsSparseVectorSum sum;
  // todo @Julian: Setting up the sparse vector sum is equivalent to calling
  // HVector::setup() I think there should instead be overloads where the result
  // vector is of type HVectorQuad for the future and not the boolean parameter
  // quad_precision. Then the buffer can be maintained similar to row_ap.
  if (quad_precision) sum.setDimension(num_col_);
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::priceByRowWithSwitch\n");
  // (Continue) hyper-sparse row-wise PRICE with possible switches to
  // standard row-wise PRICE either immediately based on historical
  // density or during hyper-sparse PRICE if there is too much fill-in
  HighsInt next_index = from_index;
  // Possibly don't perform hyper-sparse PRICE based on historical density
  //
  // Ensure that result was set up for this number of columns, and
  // that result.index is still of correct size
  assert(HighsInt(result.size) == this->num_col_);
  assert(HighsInt(result.index.size()) == this->num_col_);
  if (expected_density <= kHyperPriceDensity) {
    double inv_num_col = 1.0 / this->num_col_;
    for (HighsInt ix = next_index; ix < column.count; ix++) {
      HighsInt iRow = column.index[ix];
      // Determine whether p_end_ or the next start_ ends the loop
      HighsInt to_iEl;
      if (this->format_ == MatrixFormat::kRowwisePartitioned) {
        to_iEl = this->p_end_[iRow];
      } else {
        to_iEl = this->start_[iRow + 1];
      }
      // Possibly switch to standard row-wise price
      HighsInt row_num_nz = to_iEl - this->start_[iRow];
      double local_density = (1.0 * result.count) * inv_num_col;
      bool switch_to_dense = result.count + row_num_nz >= this->num_col_ ||
                             local_density > switch_density;
      if (switch_to_dense) break;
      double multiplier = column.array[iRow];
      if (debug_report == kDebugReportAll || debug_report == iRow)
        debugReportRowPrice(iRow, multiplier, to_iEl, result.array);
      if (multiplier) {
        if (quad_precision) {
          for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
            sum.add(this->index_[iEl], multiplier * this->value_[iEl]);
          }
        } else {
          for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
            HighsInt iCol = this->index_[iEl];
            double value0 = result.array[iCol];
            double value1 = value0 + multiplier * this->value_[iEl];
            if (value0 == 0) result.index[result.count++] = iCol;
            result.array[iCol] =
                (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
          }
        }
      }
      next_index = ix + 1;
    }
  }
  if (quad_precision)
    sum.cleanup([](HighsInt, double x) { return std::abs(x) <= kHighsTiny; });
  if (next_index < column.count) {
    // PRICE is not complete: finish without maintaining nonzeros of result
    if (quad_precision) {
      std::vector<HighsCDouble> result_array = sum.values;
      this->priceByRowDenseResult(result_array, column, next_index);
      // Determine indices of nonzeros in result
      result.count = 0;
      for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
        double value1 = (double)result_array[iCol];
        if (fabs(value1) < kHighsTiny) {
          result.array[iCol] = 0;
        } else {
          result.array[iCol] = value1;
          result.index[result.count++] = iCol;
        }
      }
    } else {
      this->priceByRowDenseResult(result.array, column, next_index);
      // Determine indices of nonzeros in result
      result.count = 0;
      for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
        double value1 = result.array[iCol];
        if (fabs(value1) < kHighsTiny) {
          result.array[iCol] = 0;
        } else {
          result.index[result.count++] = iCol;
        }
      }
    }
  } else {
    if (quad_precision) {
      // HVector result should have result.index of size this->num_col_
      // by virtue of result.setup. However, it will generally lose
      // this property by virtue of the following move
      result.index = std::move(sum.nonzeroinds);
      HighsInt result_num_nz = result.index.size();
      // Restore the size of result.index
      result.index.resize(this->num_col_);
      result.count = result_num_nz;
      for (HighsInt i = 0; i < result_num_nz; ++i) {
        HighsInt iRow = result.index[i];
        result.array[iRow] = sum.getValue(iRow);
      }
    } else {
      // PRICE is complete maintaining nonzeros of result
      // Remove small values
      result.tight();
    }
  }
}